

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O2

void volkFinalize(void)

{
  if (loadedModule != (void *)0x0) {
    dlclose();
  }
  vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)0x0;
  vkCreateInstance = (PFN_vkCreateInstance)0x0;
  vkEnumerateInstanceExtensionProperties = (PFN_vkEnumerateInstanceExtensionProperties)0x0;
  vkEnumerateInstanceLayerProperties = (PFN_vkEnumerateInstanceLayerProperties)0x0;
  vkEnumerateInstanceVersion = (PFN_vkEnumerateInstanceVersion)0x0;
  vkCreateDevice = (PFN_vkCreateDevice)0x0;
  vkDestroyInstance = (PFN_vkDestroyInstance)0x0;
  vkEnumerateDeviceExtensionProperties = (PFN_vkEnumerateDeviceExtensionProperties)0x0;
  vkEnumerateDeviceLayerProperties = (PFN_vkEnumerateDeviceLayerProperties)0x0;
  vkEnumeratePhysicalDevices = (PFN_vkEnumeratePhysicalDevices)0x0;
  vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)0x0;
  vkGetPhysicalDeviceFeatures = (PFN_vkGetPhysicalDeviceFeatures)0x0;
  vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)0x0;
  vkGetPhysicalDeviceImageFormatProperties = (PFN_vkGetPhysicalDeviceImageFormatProperties)0x0;
  vkGetPhysicalDeviceMemoryProperties = (PFN_vkGetPhysicalDeviceMemoryProperties)0x0;
  vkGetPhysicalDeviceProperties = (PFN_vkGetPhysicalDeviceProperties)0x0;
  vkGetPhysicalDeviceQueueFamilyProperties = (PFN_vkGetPhysicalDeviceQueueFamilyProperties)0x0;
  vkGetPhysicalDeviceSparseImageFormatProperties =
       (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)0x0;
  vkEnumeratePhysicalDeviceGroups = (PFN_vkEnumeratePhysicalDeviceGroups)0x0;
  vkGetPhysicalDeviceExternalBufferProperties = (PFN_vkGetPhysicalDeviceExternalBufferProperties)0x0
  ;
  vkGetPhysicalDeviceExternalFenceProperties = (PFN_vkGetPhysicalDeviceExternalFenceProperties)0x0;
  vkGetPhysicalDeviceExternalSemaphoreProperties =
       (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)0x0;
  vkGetPhysicalDeviceFeatures2 = (PFN_vkGetPhysicalDeviceFeatures2)0x0;
  vkGetPhysicalDeviceFormatProperties2 = (PFN_vkGetPhysicalDeviceFormatProperties2)0x0;
  vkGetPhysicalDeviceImageFormatProperties2 = (PFN_vkGetPhysicalDeviceImageFormatProperties2)0x0;
  vkGetPhysicalDeviceMemoryProperties2 = (PFN_vkGetPhysicalDeviceMemoryProperties2)0x0;
  vkGetPhysicalDeviceProperties2 = (PFN_vkGetPhysicalDeviceProperties2)0x0;
  vkGetPhysicalDeviceQueueFamilyProperties2 = (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)0x0;
  vkGetPhysicalDeviceSparseImageFormatProperties2 =
       (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)0x0;
  vkGetPhysicalDeviceToolProperties = (PFN_vkGetPhysicalDeviceToolProperties)0x0;
  vkAcquireDrmDisplayEXT = (PFN_vkAcquireDrmDisplayEXT)0x0;
  vkGetDrmDisplayEXT = (PFN_vkGetDrmDisplayEXT)0x0;
  vkGetPhysicalDeviceCalibrateableTimeDomainsEXT =
       (PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT)0x0;
  vkCreateDebugReportCallbackEXT = (PFN_vkCreateDebugReportCallbackEXT)0x0;
  vkDebugReportMessageEXT = (PFN_vkDebugReportMessageEXT)0x0;
  vkDestroyDebugReportCallbackEXT = (PFN_vkDestroyDebugReportCallbackEXT)0x0;
  vkCmdBeginDebugUtilsLabelEXT = (PFN_vkCmdBeginDebugUtilsLabelEXT)0x0;
  vkCmdEndDebugUtilsLabelEXT = (PFN_vkCmdEndDebugUtilsLabelEXT)0x0;
  vkCmdInsertDebugUtilsLabelEXT = (PFN_vkCmdInsertDebugUtilsLabelEXT)0x0;
  vkCreateDebugUtilsMessengerEXT = (PFN_vkCreateDebugUtilsMessengerEXT)0x0;
  vkDestroyDebugUtilsMessengerEXT = (PFN_vkDestroyDebugUtilsMessengerEXT)0x0;
  vkQueueBeginDebugUtilsLabelEXT = (PFN_vkQueueBeginDebugUtilsLabelEXT)0x0;
  vkQueueEndDebugUtilsLabelEXT = (PFN_vkQueueEndDebugUtilsLabelEXT)0x0;
  vkQueueInsertDebugUtilsLabelEXT = (PFN_vkQueueInsertDebugUtilsLabelEXT)0x0;
  vkSetDebugUtilsObjectNameEXT = (PFN_vkSetDebugUtilsObjectNameEXT)0x0;
  vkSetDebugUtilsObjectTagEXT = (PFN_vkSetDebugUtilsObjectTagEXT)0x0;
  vkSubmitDebugUtilsMessageEXT = (PFN_vkSubmitDebugUtilsMessageEXT)0x0;
  vkReleaseDisplayEXT = (PFN_vkReleaseDisplayEXT)0x0;
  vkGetPhysicalDeviceSurfaceCapabilities2EXT = (PFN_vkGetPhysicalDeviceSurfaceCapabilities2EXT)0x0;
  vkCreateHeadlessSurfaceEXT = (PFN_vkCreateHeadlessSurfaceEXT)0x0;
  vkGetPhysicalDeviceMultisamplePropertiesEXT = (PFN_vkGetPhysicalDeviceMultisamplePropertiesEXT)0x0
  ;
  vkGetPhysicalDeviceToolPropertiesEXT = (PFN_vkGetPhysicalDeviceToolPropertiesEXT)0x0;
  vkGetPhysicalDeviceCalibrateableTimeDomainsKHR =
       (PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsKHR)0x0;
  vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR =
       (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR)0x0;
  vkEnumeratePhysicalDeviceGroupsKHR = (PFN_vkEnumeratePhysicalDeviceGroupsKHR)0x0;
  vkCreateDisplayModeKHR = (PFN_vkCreateDisplayModeKHR)0x0;
  vkCreateDisplayPlaneSurfaceKHR = (PFN_vkCreateDisplayPlaneSurfaceKHR)0x0;
  vkGetDisplayModePropertiesKHR = (PFN_vkGetDisplayModePropertiesKHR)0x0;
  vkGetDisplayPlaneCapabilitiesKHR = (PFN_vkGetDisplayPlaneCapabilitiesKHR)0x0;
  vkGetDisplayPlaneSupportedDisplaysKHR = (PFN_vkGetDisplayPlaneSupportedDisplaysKHR)0x0;
  vkGetPhysicalDeviceDisplayPlanePropertiesKHR =
       (PFN_vkGetPhysicalDeviceDisplayPlanePropertiesKHR)0x0;
  vkGetPhysicalDeviceDisplayPropertiesKHR = (PFN_vkGetPhysicalDeviceDisplayPropertiesKHR)0x0;
  vkGetPhysicalDeviceExternalFencePropertiesKHR =
       (PFN_vkGetPhysicalDeviceExternalFencePropertiesKHR)0x0;
  vkGetPhysicalDeviceExternalBufferPropertiesKHR =
       (PFN_vkGetPhysicalDeviceExternalBufferPropertiesKHR)0x0;
  vkGetPhysicalDeviceExternalSemaphorePropertiesKHR =
       (PFN_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR)0x0;
  vkGetPhysicalDeviceFragmentShadingRatesKHR = (PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR)0x0;
  vkGetDisplayModeProperties2KHR = (PFN_vkGetDisplayModeProperties2KHR)0x0;
  vkGetDisplayPlaneCapabilities2KHR = (PFN_vkGetDisplayPlaneCapabilities2KHR)0x0;
  vkGetPhysicalDeviceDisplayPlaneProperties2KHR =
       (PFN_vkGetPhysicalDeviceDisplayPlaneProperties2KHR)0x0;
  vkGetPhysicalDeviceDisplayProperties2KHR = (PFN_vkGetPhysicalDeviceDisplayProperties2KHR)0x0;
  vkGetPhysicalDeviceFeatures2KHR = (PFN_vkGetPhysicalDeviceFeatures2KHR)0x0;
  vkGetPhysicalDeviceFormatProperties2KHR = (PFN_vkGetPhysicalDeviceFormatProperties2KHR)0x0;
  vkGetPhysicalDeviceImageFormatProperties2KHR =
       (PFN_vkGetPhysicalDeviceImageFormatProperties2KHR)0x0;
  vkGetPhysicalDeviceMemoryProperties2KHR = (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)0x0;
  vkGetPhysicalDeviceProperties2KHR = (PFN_vkGetPhysicalDeviceProperties2KHR)0x0;
  vkGetPhysicalDeviceQueueFamilyProperties2KHR =
       (PFN_vkGetPhysicalDeviceQueueFamilyProperties2KHR)0x0;
  vkGetPhysicalDeviceSparseImageFormatProperties2KHR =
       (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2KHR)0x0;
  vkGetPhysicalDeviceSurfaceCapabilities2KHR = (PFN_vkGetPhysicalDeviceSurfaceCapabilities2KHR)0x0;
  vkGetPhysicalDeviceSurfaceFormats2KHR = (PFN_vkGetPhysicalDeviceSurfaceFormats2KHR)0x0;
  vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR =
       (PFN_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR)0x0;
  vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR =
       (PFN_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR)0x0;
  vkDestroySurfaceKHR = (PFN_vkDestroySurfaceKHR)0x0;
  vkGetPhysicalDeviceSurfaceCapabilitiesKHR = (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)0x0;
  vkGetPhysicalDeviceSurfaceFormatsKHR = (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)0x0;
  vkGetPhysicalDeviceSurfacePresentModesKHR = (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)0x0;
  vkGetPhysicalDeviceSurfaceSupportKHR = (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)0x0;
  vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR =
       (PFN_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR)0x0;
  vkGetPhysicalDeviceVideoCapabilitiesKHR = (PFN_vkGetPhysicalDeviceVideoCapabilitiesKHR)0x0;
  vkGetPhysicalDeviceVideoFormatPropertiesKHR = (PFN_vkGetPhysicalDeviceVideoFormatPropertiesKHR)0x0
  ;
  vkCreateXcbSurfaceKHR = (PFN_vkCreateXcbSurfaceKHR)0x0;
  vkGetPhysicalDeviceXcbPresentationSupportKHR =
       (PFN_vkGetPhysicalDeviceXcbPresentationSupportKHR)0x0;
  vkCreateXlibSurfaceKHR = (PFN_vkCreateXlibSurfaceKHR)0x0;
  vkGetPhysicalDeviceXlibPresentationSupportKHR =
       (PFN_vkGetPhysicalDeviceXlibPresentationSupportKHR)0x0;
  vkGetPhysicalDeviceCooperativeMatrixPropertiesNV =
       (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV)0x0;
  vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV =
       (PFN_vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV)0x0;
  vkGetPhysicalDeviceCooperativeVectorPropertiesNV =
       (PFN_vkGetPhysicalDeviceCooperativeVectorPropertiesNV)0x0;
  vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV =
       (PFN_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV)0x0;
  vkGetPhysicalDeviceExternalImageFormatPropertiesNV =
       (PFN_vkGetPhysicalDeviceExternalImageFormatPropertiesNV)0x0;
  vkGetPhysicalDeviceOpticalFlowImageFormatsNV =
       (PFN_vkGetPhysicalDeviceOpticalFlowImageFormatsNV)0x0;
  vkGetPhysicalDevicePresentRectanglesKHR = (PFN_vkGetPhysicalDevicePresentRectanglesKHR)0x0;
  vkAllocateCommandBuffers = (PFN_vkAllocateCommandBuffers)0x0;
  vkAllocateDescriptorSets = (PFN_vkAllocateDescriptorSets)0x0;
  vkAllocateMemory = (PFN_vkAllocateMemory)0x0;
  vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)0x0;
  vkBindBufferMemory = (PFN_vkBindBufferMemory)0x0;
  vkBindImageMemory = (PFN_vkBindImageMemory)0x0;
  vkCmdBeginQuery = (PFN_vkCmdBeginQuery)0x0;
  vkCmdBeginRenderPass = (PFN_vkCmdBeginRenderPass)0x0;
  vkCmdBindDescriptorSets = (PFN_vkCmdBindDescriptorSets)0x0;
  vkCmdBindIndexBuffer = (PFN_vkCmdBindIndexBuffer)0x0;
  vkCmdBindPipeline = (PFN_vkCmdBindPipeline)0x0;
  vkCmdBindVertexBuffers = (PFN_vkCmdBindVertexBuffers)0x0;
  vkCmdBlitImage = (PFN_vkCmdBlitImage)0x0;
  vkCmdClearAttachments = (PFN_vkCmdClearAttachments)0x0;
  vkCmdClearColorImage = (PFN_vkCmdClearColorImage)0x0;
  vkCmdClearDepthStencilImage = (PFN_vkCmdClearDepthStencilImage)0x0;
  vkCmdCopyBuffer = (PFN_vkCmdCopyBuffer)0x0;
  vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)0x0;
  vkCmdCopyImage = (PFN_vkCmdCopyImage)0x0;
  vkCmdCopyImageToBuffer = (PFN_vkCmdCopyImageToBuffer)0x0;
  vkCmdCopyQueryPoolResults = (PFN_vkCmdCopyQueryPoolResults)0x0;
  vkCmdDispatch = (PFN_vkCmdDispatch)0x0;
  vkCmdDispatchIndirect = (PFN_vkCmdDispatchIndirect)0x0;
  vkCmdDraw = (PFN_vkCmdDraw)0x0;
  vkCmdDrawIndexed = (PFN_vkCmdDrawIndexed)0x0;
  vkCmdDrawIndexedIndirect = (PFN_vkCmdDrawIndexedIndirect)0x0;
  vkCmdDrawIndirect = (PFN_vkCmdDrawIndirect)0x0;
  vkCmdEndQuery = (PFN_vkCmdEndQuery)0x0;
  vkCmdEndRenderPass = (PFN_vkCmdEndRenderPass)0x0;
  vkCmdExecuteCommands = (PFN_vkCmdExecuteCommands)0x0;
  vkCmdFillBuffer = (PFN_vkCmdFillBuffer)0x0;
  vkCmdNextSubpass = (PFN_vkCmdNextSubpass)0x0;
  vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)0x0;
  vkCmdPushConstants = (PFN_vkCmdPushConstants)0x0;
  vkCmdResetEvent = (PFN_vkCmdResetEvent)0x0;
  vkCmdResetQueryPool = (PFN_vkCmdResetQueryPool)0x0;
  vkCmdResolveImage = (PFN_vkCmdResolveImage)0x0;
  vkCmdSetBlendConstants = (PFN_vkCmdSetBlendConstants)0x0;
  vkCmdSetDepthBias = (PFN_vkCmdSetDepthBias)0x0;
  vkCmdSetDepthBounds = (PFN_vkCmdSetDepthBounds)0x0;
  vkCmdSetEvent = (PFN_vkCmdSetEvent)0x0;
  vkCmdSetLineWidth = (PFN_vkCmdSetLineWidth)0x0;
  vkCmdSetScissor = (PFN_vkCmdSetScissor)0x0;
  vkCmdSetStencilCompareMask = (PFN_vkCmdSetStencilCompareMask)0x0;
  vkCmdSetStencilReference = (PFN_vkCmdSetStencilReference)0x0;
  vkCmdSetStencilWriteMask = (PFN_vkCmdSetStencilWriteMask)0x0;
  vkCmdSetViewport = (PFN_vkCmdSetViewport)0x0;
  vkCmdUpdateBuffer = (PFN_vkCmdUpdateBuffer)0x0;
  vkCmdWaitEvents = (PFN_vkCmdWaitEvents)0x0;
  vkCmdWriteTimestamp = (PFN_vkCmdWriteTimestamp)0x0;
  vkCreateBuffer = (PFN_vkCreateBuffer)0x0;
  vkCreateBufferView = (PFN_vkCreateBufferView)0x0;
  vkCreateCommandPool = (PFN_vkCreateCommandPool)0x0;
  vkCreateComputePipelines = (PFN_vkCreateComputePipelines)0x0;
  vkCreateDescriptorPool = (PFN_vkCreateDescriptorPool)0x0;
  vkCreateDescriptorSetLayout = (PFN_vkCreateDescriptorSetLayout)0x0;
  vkCreateEvent = (PFN_vkCreateEvent)0x0;
  vkCreateFence = (PFN_vkCreateFence)0x0;
  vkCreateFramebuffer = (PFN_vkCreateFramebuffer)0x0;
  vkCreateGraphicsPipelines = (PFN_vkCreateGraphicsPipelines)0x0;
  vkCreateImage = (PFN_vkCreateImage)0x0;
  vkCreateImageView = (PFN_vkCreateImageView)0x0;
  vkCreatePipelineCache = (PFN_vkCreatePipelineCache)0x0;
  vkCreatePipelineLayout = (PFN_vkCreatePipelineLayout)0x0;
  vkCreateQueryPool = (PFN_vkCreateQueryPool)0x0;
  vkCreateRenderPass = (PFN_vkCreateRenderPass)0x0;
  vkCreateSampler = (PFN_vkCreateSampler)0x0;
  vkCreateSemaphore = (PFN_vkCreateSemaphore)0x0;
  vkCreateShaderModule = (PFN_vkCreateShaderModule)0x0;
  vkDestroyBuffer = (PFN_vkDestroyBuffer)0x0;
  vkDestroyBufferView = (PFN_vkDestroyBufferView)0x0;
  vkDestroyCommandPool = (PFN_vkDestroyCommandPool)0x0;
  vkDestroyDescriptorPool = (PFN_vkDestroyDescriptorPool)0x0;
  vkDestroyDescriptorSetLayout = (PFN_vkDestroyDescriptorSetLayout)0x0;
  vkDestroyDevice = (PFN_vkDestroyDevice)0x0;
  vkDestroyEvent = (PFN_vkDestroyEvent)0x0;
  vkDestroyFence = (PFN_vkDestroyFence)0x0;
  vkDestroyFramebuffer = (PFN_vkDestroyFramebuffer)0x0;
  vkDestroyImage = (PFN_vkDestroyImage)0x0;
  vkDestroyImageView = (PFN_vkDestroyImageView)0x0;
  vkDestroyPipeline = (PFN_vkDestroyPipeline)0x0;
  vkDestroyPipelineCache = (PFN_vkDestroyPipelineCache)0x0;
  vkDestroyPipelineLayout = (PFN_vkDestroyPipelineLayout)0x0;
  vkDestroyQueryPool = (PFN_vkDestroyQueryPool)0x0;
  vkDestroyRenderPass = (PFN_vkDestroyRenderPass)0x0;
  vkDestroySampler = (PFN_vkDestroySampler)0x0;
  vkDestroySemaphore = (PFN_vkDestroySemaphore)0x0;
  vkDestroyShaderModule = (PFN_vkDestroyShaderModule)0x0;
  vkDeviceWaitIdle = (PFN_vkDeviceWaitIdle)0x0;
  vkEndCommandBuffer = (PFN_vkEndCommandBuffer)0x0;
  vkFlushMappedMemoryRanges = (PFN_vkFlushMappedMemoryRanges)0x0;
  vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)0x0;
  vkFreeDescriptorSets = (PFN_vkFreeDescriptorSets)0x0;
  vkFreeMemory = (PFN_vkFreeMemory)0x0;
  vkGetBufferMemoryRequirements = (PFN_vkGetBufferMemoryRequirements)0x0;
  vkGetDeviceMemoryCommitment = (PFN_vkGetDeviceMemoryCommitment)0x0;
  vkGetDeviceQueue = (PFN_vkGetDeviceQueue)0x0;
  vkGetEventStatus = (PFN_vkGetEventStatus)0x0;
  vkGetFenceStatus = (PFN_vkGetFenceStatus)0x0;
  vkGetImageMemoryRequirements = (PFN_vkGetImageMemoryRequirements)0x0;
  vkGetImageSparseMemoryRequirements = (PFN_vkGetImageSparseMemoryRequirements)0x0;
  vkGetImageSubresourceLayout = (PFN_vkGetImageSubresourceLayout)0x0;
  vkGetPipelineCacheData = (PFN_vkGetPipelineCacheData)0x0;
  vkGetQueryPoolResults = (PFN_vkGetQueryPoolResults)0x0;
  vkGetRenderAreaGranularity = (PFN_vkGetRenderAreaGranularity)0x0;
  vkInvalidateMappedMemoryRanges = (PFN_vkInvalidateMappedMemoryRanges)0x0;
  vkMapMemory = (PFN_vkMapMemory)0x0;
  vkMergePipelineCaches = (PFN_vkMergePipelineCaches)0x0;
  vkQueueBindSparse = (PFN_vkQueueBindSparse)0x0;
  vkQueueSubmit = (PFN_vkQueueSubmit)0x0;
  vkQueueWaitIdle = (PFN_vkQueueWaitIdle)0x0;
  vkResetCommandBuffer = (PFN_vkResetCommandBuffer)0x0;
  vkResetCommandPool = (PFN_vkResetCommandPool)0x0;
  vkResetDescriptorPool = (PFN_vkResetDescriptorPool)0x0;
  vkResetEvent = (PFN_vkResetEvent)0x0;
  vkResetFences = (PFN_vkResetFences)0x0;
  vkSetEvent = (PFN_vkSetEvent)0x0;
  vkUnmapMemory = (PFN_vkUnmapMemory)0x0;
  vkUpdateDescriptorSets = (PFN_vkUpdateDescriptorSets)0x0;
  vkWaitForFences = (PFN_vkWaitForFences)0x0;
  vkBindBufferMemory2 = (PFN_vkBindBufferMemory2)0x0;
  vkBindImageMemory2 = (PFN_vkBindImageMemory2)0x0;
  vkCmdDispatchBase = (PFN_vkCmdDispatchBase)0x0;
  vkCmdSetDeviceMask = (PFN_vkCmdSetDeviceMask)0x0;
  vkCreateDescriptorUpdateTemplate = (PFN_vkCreateDescriptorUpdateTemplate)0x0;
  vkCreateSamplerYcbcrConversion = (PFN_vkCreateSamplerYcbcrConversion)0x0;
  vkDestroyDescriptorUpdateTemplate = (PFN_vkDestroyDescriptorUpdateTemplate)0x0;
  vkDestroySamplerYcbcrConversion = (PFN_vkDestroySamplerYcbcrConversion)0x0;
  vkGetBufferMemoryRequirements2 = (PFN_vkGetBufferMemoryRequirements2)0x0;
  vkGetDescriptorSetLayoutSupport = (PFN_vkGetDescriptorSetLayoutSupport)0x0;
  vkGetDeviceGroupPeerMemoryFeatures = (PFN_vkGetDeviceGroupPeerMemoryFeatures)0x0;
  vkGetDeviceQueue2 = (PFN_vkGetDeviceQueue2)0x0;
  vkGetImageMemoryRequirements2 = (PFN_vkGetImageMemoryRequirements2)0x0;
  vkGetImageSparseMemoryRequirements2 = (PFN_vkGetImageSparseMemoryRequirements2)0x0;
  vkTrimCommandPool = (PFN_vkTrimCommandPool)0x0;
  vkUpdateDescriptorSetWithTemplate = (PFN_vkUpdateDescriptorSetWithTemplate)0x0;
  vkCmdBeginRenderPass2 = (PFN_vkCmdBeginRenderPass2)0x0;
  vkCmdDrawIndexedIndirectCount = (PFN_vkCmdDrawIndexedIndirectCount)0x0;
  vkCmdDrawIndirectCount = (PFN_vkCmdDrawIndirectCount)0x0;
  vkCmdEndRenderPass2 = (PFN_vkCmdEndRenderPass2)0x0;
  vkCmdNextSubpass2 = (PFN_vkCmdNextSubpass2)0x0;
  vkCreateRenderPass2 = (PFN_vkCreateRenderPass2)0x0;
  vkGetBufferDeviceAddress = (PFN_vkGetBufferDeviceAddress)0x0;
  vkGetBufferOpaqueCaptureAddress = (PFN_vkGetBufferOpaqueCaptureAddress)0x0;
  vkGetDeviceMemoryOpaqueCaptureAddress = (PFN_vkGetDeviceMemoryOpaqueCaptureAddress)0x0;
  vkGetSemaphoreCounterValue = (PFN_vkGetSemaphoreCounterValue)0x0;
  vkResetQueryPool = (PFN_vkResetQueryPool)0x0;
  vkSignalSemaphore = (PFN_vkSignalSemaphore)0x0;
  vkWaitSemaphores = (PFN_vkWaitSemaphores)0x0;
  vkCmdBeginRendering = (PFN_vkCmdBeginRendering)0x0;
  vkCmdBindVertexBuffers2 = (PFN_vkCmdBindVertexBuffers2)0x0;
  vkCmdBlitImage2 = (PFN_vkCmdBlitImage2)0x0;
  vkCmdCopyBuffer2 = (PFN_vkCmdCopyBuffer2)0x0;
  vkCmdCopyBufferToImage2 = (PFN_vkCmdCopyBufferToImage2)0x0;
  vkCmdCopyImage2 = (PFN_vkCmdCopyImage2)0x0;
  vkBuildAccelerationStructuresKHR = (PFN_vkBuildAccelerationStructuresKHR)0x0;
  vkUninitializePerformanceApiINTEL = (PFN_vkUninitializePerformanceApiINTEL)0x0;
  vkReleasePerformanceConfigurationINTEL = (PFN_vkReleasePerformanceConfigurationINTEL)0x0;
  vkQueueSetPerformanceConfigurationINTEL = (PFN_vkQueueSetPerformanceConfigurationINTEL)0x0;
  vkInitializePerformanceApiINTEL = (PFN_vkInitializePerformanceApiINTEL)0x0;
  vkGetPerformanceParameterINTEL = (PFN_vkGetPerformanceParameterINTEL)0x0;
  vkCmdSetPerformanceStreamMarkerINTEL = (PFN_vkCmdSetPerformanceStreamMarkerINTEL)0x0;
  vkCmdSetPerformanceOverrideINTEL = (PFN_vkCmdSetPerformanceOverrideINTEL)0x0;
  vkCmdSetPerformanceMarkerINTEL = (PFN_vkCmdSetPerformanceMarkerINTEL)0x0;
  vkAcquirePerformanceConfigurationINTEL = (PFN_vkAcquirePerformanceConfigurationINTEL)0x0;
  vkCmdSubpassShadingHUAWEI = (PFN_vkCmdSubpassShadingHUAWEI)0x0;
  vkGetDeviceSubpassShadingMaxWorkgroupSizeHUAWEI =
       (PFN_vkGetDeviceSubpassShadingMaxWorkgroupSizeHUAWEI)0x0;
  vkCmdBindInvocationMaskHUAWEI = (PFN_vkCmdBindInvocationMaskHUAWEI)0x0;
  vkCmdDrawClusterIndirectHUAWEI = (PFN_vkCmdDrawClusterIndirectHUAWEI)0x0;
  vkCmdDrawClusterHUAWEI = (PFN_vkCmdDrawClusterHUAWEI)0x0;
  vkGetRefreshCycleDurationGOOGLE = (PFN_vkGetRefreshCycleDurationGOOGLE)0x0;
  vkGetPastPresentationTimingGOOGLE = (PFN_vkGetPastPresentationTimingGOOGLE)0x0;
  vkMergeValidationCachesEXT = (PFN_vkMergeValidationCachesEXT)0x0;
  vkGetValidationCacheDataEXT = (PFN_vkGetValidationCacheDataEXT)0x0;
  vkDestroyValidationCacheEXT = (PFN_vkDestroyValidationCacheEXT)0x0;
  vkCreateValidationCacheEXT = (PFN_vkCreateValidationCacheEXT)0x0;
  vkCmdEndTransformFeedbackEXT = (PFN_vkCmdEndTransformFeedbackEXT)0x0;
  vkCmdEndQueryIndexedEXT = (PFN_vkCmdEndQueryIndexedEXT)0x0;
  vkCmdDrawIndirectByteCountEXT = (PFN_vkCmdDrawIndirectByteCountEXT)0x0;
  vkCmdBindTransformFeedbackBuffersEXT = (PFN_vkCmdBindTransformFeedbackBuffersEXT)0x0;
  vkCmdBeginTransformFeedbackEXT = (PFN_vkCmdBeginTransformFeedbackEXT)0x0;
  vkCmdBeginQueryIndexedEXT = (PFN_vkCmdBeginQueryIndexedEXT)0x0;
  vkReleaseSwapchainImagesEXT = (PFN_vkReleaseSwapchainImagesEXT)0x0;
  vkGetShaderBinaryDataEXT = (PFN_vkGetShaderBinaryDataEXT)0x0;
  vkDestroyShaderEXT = (PFN_vkDestroyShaderEXT)0x0;
  vkCreateShadersEXT = (PFN_vkCreateShadersEXT)0x0;
  vkCmdBindShadersEXT = (PFN_vkCmdBindShadersEXT)0x0;
  vkGetShaderModuleIdentifierEXT = (PFN_vkGetShaderModuleIdentifierEXT)0x0;
  vkGetShaderModuleCreateInfoIdentifierEXT = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
  vkCmdSetSampleLocationsEXT = (PFN_vkCmdSetSampleLocationsEXT)0x0;
  vkSetPrivateDataEXT = (PFN_vkSetPrivateDataEXT)0x0;
  vkGetPrivateDataEXT = (PFN_vkGetPrivateDataEXT)0x0;
  vkDestroyPrivateDataSlotEXT = (PFN_vkDestroyPrivateDataSlotEXT)0x0;
  vkCreatePrivateDataSlotEXT = (PFN_vkCreatePrivateDataSlotEXT)0x0;
  vkGetPipelinePropertiesEXT = (PFN_vkGetPipelinePropertiesEXT)0x0;
  vkSetDeviceMemoryPriorityEXT = (PFN_vkSetDeviceMemoryPriorityEXT)0x0;
  vkWriteMicromapsPropertiesEXT = (PFN_vkWriteMicromapsPropertiesEXT)0x0;
  vkGetMicromapBuildSizesEXT = (PFN_vkGetMicromapBuildSizesEXT)0x0;
  vkGetDeviceMicromapCompatibilityEXT = (PFN_vkGetDeviceMicromapCompatibilityEXT)0x0;
  vkDestroyMicromapEXT = (PFN_vkDestroyMicromapEXT)0x0;
  vkCreateMicromapEXT = (PFN_vkCreateMicromapEXT)0x0;
  vkCopyMicromapToMemoryEXT = (PFN_vkCopyMicromapToMemoryEXT)0x0;
  vkCopyMicromapEXT = (PFN_vkCopyMicromapEXT)0x0;
  vkCopyMemoryToMicromapEXT = (PFN_vkCopyMemoryToMicromapEXT)0x0;
  vkCmdWriteMicromapsPropertiesEXT = (PFN_vkCmdWriteMicromapsPropertiesEXT)0x0;
  vkCmdCopyMicromapToMemoryEXT = (PFN_vkCmdCopyMicromapToMemoryEXT)0x0;
  vkCmdCopyMicromapEXT = (PFN_vkCmdCopyMicromapEXT)0x0;
  vkCmdCopyMemoryToMicromapEXT = (PFN_vkCmdCopyMemoryToMicromapEXT)0x0;
  vkCmdBuildMicromapsEXT = (PFN_vkCmdBuildMicromapsEXT)0x0;
  vkBuildMicromapsEXT = (PFN_vkBuildMicromapsEXT)0x0;
  vkCmdDrawMultiIndexedEXT = (PFN_vkCmdDrawMultiIndexedEXT)0x0;
  vkCmdDrawMultiEXT = (PFN_vkCmdDrawMultiEXT)0x0;
  vkCmdDrawMeshTasksIndirectCountEXT = (PFN_vkCmdDrawMeshTasksIndirectCountEXT)0x0;
  vkCmdDrawMeshTasksIndirectEXT = (PFN_vkCmdDrawMeshTasksIndirectEXT)0x0;
  vkCmdDrawMeshTasksEXT = (PFN_vkCmdDrawMeshTasksEXT)0x0;
  vkCmdSetLineStippleEXT = (PFN_vkCmdSetLineStippleEXT)0x0;
  vkGetImageDrmFormatModifierPropertiesEXT = (PFN_vkGetImageDrmFormatModifierPropertiesEXT)0x0;
  vkResetQueryPoolEXT = (PFN_vkResetQueryPoolEXT)0x0;
  vkTransitionImageLayoutEXT = (PFN_vkTransitionImageLayoutEXT)0x0;
  vkCopyMemoryToImageEXT = (PFN_vkCopyMemoryToImageEXT)0x0;
  vkCopyImageToMemoryEXT = (PFN_vkCopyImageToMemoryEXT)0x0;
  vkCopyImageToImageEXT = (PFN_vkCopyImageToImageEXT)0x0;
  vkSetHdrMetadataEXT = (PFN_vkSetHdrMetadataEXT)0x0;
  vkGetMemoryHostPointerPropertiesEXT = (PFN_vkGetMemoryHostPointerPropertiesEXT)0x0;
  vkRegisterDisplayEventEXT = (PFN_vkRegisterDisplayEventEXT)0x0;
  vkRegisterDeviceEventEXT = (PFN_vkRegisterDeviceEventEXT)0x0;
  vkGetSwapchainCounterEXT = (PFN_vkGetSwapchainCounterEXT)0x0;
  vkDisplayPowerControlEXT = (PFN_vkDisplayPowerControlEXT)0x0;
  vkCmdSetDiscardRectangleModeEXT = (PFN_vkCmdSetDiscardRectangleModeEXT)0x0;
  vkCmdSetDiscardRectangleEnableEXT = (PFN_vkCmdSetDiscardRectangleEnableEXT)0x0;
  vkCmdSetDiscardRectangleEXT = (PFN_vkCmdSetDiscardRectangleEXT)0x0;
  vkUpdateIndirectExecutionSetShaderEXT = (PFN_vkUpdateIndirectExecutionSetShaderEXT)0x0;
  vkUpdateIndirectExecutionSetPipelineEXT = (PFN_vkUpdateIndirectExecutionSetPipelineEXT)0x0;
  vkGetGeneratedCommandsMemoryRequirementsEXT = (PFN_vkGetGeneratedCommandsMemoryRequirementsEXT)0x0
  ;
  vkDestroyIndirectExecutionSetEXT = (PFN_vkDestroyIndirectExecutionSetEXT)0x0;
  vkDestroyIndirectCommandsLayoutEXT = (PFN_vkDestroyIndirectCommandsLayoutEXT)0x0;
  vkCreateIndirectExecutionSetEXT = (PFN_vkCreateIndirectExecutionSetEXT)0x0;
  vkCreateIndirectCommandsLayoutEXT = (PFN_vkCreateIndirectCommandsLayoutEXT)0x0;
  vkCmdPreprocessGeneratedCommandsEXT = (PFN_vkCmdPreprocessGeneratedCommandsEXT)0x0;
  vkCmdExecuteGeneratedCommandsEXT = (PFN_vkCmdExecuteGeneratedCommandsEXT)0x0;
  vkGetDeviceFaultInfoEXT = (PFN_vkGetDeviceFaultInfoEXT)0x0;
  vkGetAccelerationStructureOpaqueCaptureDescriptorDataEXT =
       (PFN_vkGetAccelerationStructureOpaqueCaptureDescriptorDataEXT)0x0;
  vkGetSamplerOpaqueCaptureDescriptorDataEXT = (PFN_vkGetSamplerOpaqueCaptureDescriptorDataEXT)0x0;
  vkGetImageViewOpaqueCaptureDescriptorDataEXT =
       (PFN_vkGetImageViewOpaqueCaptureDescriptorDataEXT)0x0;
  vkGetImageOpaqueCaptureDescriptorDataEXT = (PFN_vkGetImageOpaqueCaptureDescriptorDataEXT)0x0;
  vkGetDescriptorSetLayoutSizeEXT = (PFN_vkGetDescriptorSetLayoutSizeEXT)0x0;
  vkGetDescriptorSetLayoutBindingOffsetEXT = (PFN_vkGetDescriptorSetLayoutBindingOffsetEXT)0x0;
  vkGetDescriptorEXT = (PFN_vkGetDescriptorEXT)0x0;
  vkGetBufferOpaqueCaptureDescriptorDataEXT = (PFN_vkGetBufferOpaqueCaptureDescriptorDataEXT)0x0;
  vkCmdSetDescriptorBufferOffsetsEXT = (PFN_vkCmdSetDescriptorBufferOffsetsEXT)0x0;
  vkCmdBindDescriptorBuffersEXT = (PFN_vkCmdBindDescriptorBuffersEXT)0x0;
  vkCmdBindDescriptorBufferEmbeddedSamplersEXT =
       (PFN_vkCmdBindDescriptorBufferEmbeddedSamplersEXT)0x0;
  vkCmdSetDepthBias2EXT = (PFN_vkCmdSetDepthBias2EXT)0x0;
  vkDebugMarkerSetObjectTagEXT = (PFN_vkDebugMarkerSetObjectTagEXT)0x0;
  vkDebugMarkerSetObjectNameEXT = (PFN_vkDebugMarkerSetObjectNameEXT)0x0;
  vkCmdDebugMarkerInsertEXT = (PFN_vkCmdDebugMarkerInsertEXT)0x0;
  vkCmdDebugMarkerEndEXT = (PFN_vkCmdDebugMarkerEndEXT)0x0;
  vkCmdDebugMarkerBeginEXT = (PFN_vkCmdDebugMarkerBeginEXT)0x0;
  vkCmdEndConditionalRenderingEXT = (PFN_vkCmdEndConditionalRenderingEXT)0x0;
  vkCmdBeginConditionalRenderingEXT = (PFN_vkCmdBeginConditionalRenderingEXT)0x0;
  vkCmdSetColorWriteEnableEXT = (PFN_vkCmdSetColorWriteEnableEXT)0x0;
  vkGetCalibratedTimestampsEXT = (PFN_vkGetCalibratedTimestampsEXT)0x0;
  vkGetBufferDeviceAddressEXT = (PFN_vkGetBufferDeviceAddressEXT)0x0;
  vkCmdSetAttachmentFeedbackLoopEnableEXT = (PFN_vkCmdSetAttachmentFeedbackLoopEnableEXT)0x0;
  vkGetShaderInfoAMD = (PFN_vkGetShaderInfoAMD)0x0;
  vkCmdDrawIndirectCountAMD = (PFN_vkCmdDrawIndirectCountAMD)0x0;
  vkCmdDrawIndexedIndirectCountAMD = (PFN_vkCmdDrawIndexedIndirectCountAMD)0x0;
  vkSetLocalDimmingAMD = (PFN_vkSetLocalDimmingAMD)0x0;
  vkCmdWriteBufferMarker2AMD = (PFN_vkCmdWriteBufferMarker2AMD)0x0;
  vkCmdWriteBufferMarkerAMD = (PFN_vkCmdWriteBufferMarkerAMD)0x0;
  vkAntiLagUpdateAMD = (PFN_vkAntiLagUpdateAMD)0x0;
  vkGetExecutionGraphPipelineScratchSizeAMDX = (PFN_vkGetExecutionGraphPipelineScratchSizeAMDX)0x0;
  vkGetExecutionGraphPipelineNodeIndexAMDX = (PFN_vkGetExecutionGraphPipelineNodeIndexAMDX)0x0;
  vkCreateExecutionGraphPipelinesAMDX = (PFN_vkCreateExecutionGraphPipelinesAMDX)0x0;
  vkCmdInitializeGraphScratchMemoryAMDX = (PFN_vkCmdInitializeGraphScratchMemoryAMDX)0x0;
  vkCmdDispatchGraphIndirectCountAMDX = (PFN_vkCmdDispatchGraphIndirectCountAMDX)0x0;
  vkCmdDispatchGraphIndirectAMDX = (PFN_vkCmdDispatchGraphIndirectAMDX)0x0;
  vkCmdDispatchGraphAMDX = (PFN_vkCmdDispatchGraphAMDX)0x0;
  vkUnmapMemory2 = (PFN_vkUnmapMemory2)0x0;
  vkTransitionImageLayout = (PFN_vkTransitionImageLayout)0x0;
  vkMapMemory2 = (PFN_vkMapMemory2)0x0;
  vkGetRenderingAreaGranularity = (PFN_vkGetRenderingAreaGranularity)0x0;
  vkGetImageSubresourceLayout2 = (PFN_vkGetImageSubresourceLayout2)0x0;
  vkGetDeviceImageSubresourceLayout = (PFN_vkGetDeviceImageSubresourceLayout)0x0;
  vkCopyMemoryToImage = (PFN_vkCopyMemoryToImage)0x0;
  vkCopyImageToMemory = (PFN_vkCopyImageToMemory)0x0;
  vkCopyImageToImage = (PFN_vkCopyImageToImage)0x0;
  vkCmdSetRenderingInputAttachmentIndices = (PFN_vkCmdSetRenderingInputAttachmentIndices)0x0;
  vkCmdSetRenderingAttachmentLocations = (PFN_vkCmdSetRenderingAttachmentLocations)0x0;
  vkCmdSetLineStipple = (PFN_vkCmdSetLineStipple)0x0;
  vkCmdPushDescriptorSetWithTemplate2 = (PFN_vkCmdPushDescriptorSetWithTemplate2)0x0;
  vkCmdPushDescriptorSetWithTemplate = (PFN_vkCmdPushDescriptorSetWithTemplate)0x0;
  vkCmdPushDescriptorSet2 = (PFN_vkCmdPushDescriptorSet2)0x0;
  vkCmdPushDescriptorSet = (PFN_vkCmdPushDescriptorSet)0x0;
  vkCmdPushConstants2 = (PFN_vkCmdPushConstants2)0x0;
  vkCmdBindIndexBuffer2 = (PFN_vkCmdBindIndexBuffer2)0x0;
  vkCmdBindDescriptorSets2 = (PFN_vkCmdBindDescriptorSets2)0x0;
  vkSetPrivateData = (PFN_vkSetPrivateData)0x0;
  vkQueueSubmit2 = (PFN_vkQueueSubmit2)0x0;
  vkGetPrivateData = (PFN_vkGetPrivateData)0x0;
  vkGetDeviceImageSparseMemoryRequirements = (PFN_vkGetDeviceImageSparseMemoryRequirements)0x0;
  vkGetDeviceImageMemoryRequirements = (PFN_vkGetDeviceImageMemoryRequirements)0x0;
  vkGetDeviceBufferMemoryRequirements = (PFN_vkGetDeviceBufferMemoryRequirements)0x0;
  vkDestroyPrivateDataSlot = (PFN_vkDestroyPrivateDataSlot)0x0;
  vkCreatePrivateDataSlot = (PFN_vkCreatePrivateDataSlot)0x0;
  vkCmdWriteTimestamp2 = (PFN_vkCmdWriteTimestamp2)0x0;
  vkCmdWaitEvents2 = (PFN_vkCmdWaitEvents2)0x0;
  vkCmdSetViewportWithCount = (PFN_vkCmdSetViewportWithCount)0x0;
  vkCmdSetStencilTestEnable = (PFN_vkCmdSetStencilTestEnable)0x0;
  vkCmdSetStencilOp = (PFN_vkCmdSetStencilOp)0x0;
  vkCmdSetScissorWithCount = (PFN_vkCmdSetScissorWithCount)0x0;
  vkCmdSetRasterizerDiscardEnable = (PFN_vkCmdSetRasterizerDiscardEnable)0x0;
  vkCmdSetPrimitiveTopology = (PFN_vkCmdSetPrimitiveTopology)0x0;
  vkCmdSetPrimitiveRestartEnable = (PFN_vkCmdSetPrimitiveRestartEnable)0x0;
  vkCmdSetFrontFace = (PFN_vkCmdSetFrontFace)0x0;
  vkCmdSetEvent2 = (PFN_vkCmdSetEvent2)0x0;
  vkCmdSetDepthWriteEnable = (PFN_vkCmdSetDepthWriteEnable)0x0;
  vkCmdSetDepthTestEnable = (PFN_vkCmdSetDepthTestEnable)0x0;
  vkCmdSetDepthCompareOp = (PFN_vkCmdSetDepthCompareOp)0x0;
  vkCmdSetDepthBoundsTestEnable = (PFN_vkCmdSetDepthBoundsTestEnable)0x0;
  vkCmdSetDepthBiasEnable = (PFN_vkCmdSetDepthBiasEnable)0x0;
  vkCmdSetCullMode = (PFN_vkCmdSetCullMode)0x0;
  vkCmdResolveImage2 = (PFN_vkCmdResolveImage2)0x0;
  vkCmdResetEvent2 = (PFN_vkCmdResetEvent2)0x0;
  vkCmdPipelineBarrier2 = (PFN_vkCmdPipelineBarrier2)0x0;
  vkCmdEndRendering = (PFN_vkCmdEndRendering)0x0;
  vkCmdCopyImageToBuffer2 = (PFN_vkCmdCopyImageToBuffer2)0x0;
  vkCmdBuildAccelerationStructuresIndirectKHR = (PFN_vkCmdBuildAccelerationStructuresIndirectKHR)0x0
  ;
  vkCmdBuildAccelerationStructuresKHR = (PFN_vkCmdBuildAccelerationStructuresKHR)0x0;
  vkCmdCopyAccelerationStructureKHR = (PFN_vkCmdCopyAccelerationStructureKHR)0x0;
  vkCmdCopyAccelerationStructureToMemoryKHR = (PFN_vkCmdCopyAccelerationStructureToMemoryKHR)0x0;
  vkCmdCopyMemoryToAccelerationStructureKHR = (PFN_vkCmdCopyMemoryToAccelerationStructureKHR)0x0;
  vkCmdWriteAccelerationStructuresPropertiesKHR =
       (PFN_vkCmdWriteAccelerationStructuresPropertiesKHR)0x0;
  vkCopyAccelerationStructureKHR = (PFN_vkCopyAccelerationStructureKHR)0x0;
  vkCopyAccelerationStructureToMemoryKHR = (PFN_vkCopyAccelerationStructureToMemoryKHR)0x0;
  vkCopyMemoryToAccelerationStructureKHR = (PFN_vkCopyMemoryToAccelerationStructureKHR)0x0;
  vkCreateAccelerationStructureKHR = (PFN_vkCreateAccelerationStructureKHR)0x0;
  vkDestroyAccelerationStructureKHR = (PFN_vkDestroyAccelerationStructureKHR)0x0;
  vkGetAccelerationStructureBuildSizesKHR = (PFN_vkGetAccelerationStructureBuildSizesKHR)0x0;
  vkGetAccelerationStructureDeviceAddressKHR = (PFN_vkGetAccelerationStructureDeviceAddressKHR)0x0;
  vkGetDeviceAccelerationStructureCompatibilityKHR =
       (PFN_vkGetDeviceAccelerationStructureCompatibilityKHR)0x0;
  vkWriteAccelerationStructuresPropertiesKHR = (PFN_vkWriteAccelerationStructuresPropertiesKHR)0x0;
  vkBindBufferMemory2KHR = (PFN_vkBindBufferMemory2KHR)0x0;
  vkBindImageMemory2KHR = (PFN_vkBindImageMemory2KHR)0x0;
  vkGetBufferDeviceAddressKHR = (PFN_vkGetBufferDeviceAddressKHR)0x0;
  vkGetBufferOpaqueCaptureAddressKHR = (PFN_vkGetBufferOpaqueCaptureAddressKHR)0x0;
  vkGetDeviceMemoryOpaqueCaptureAddressKHR = (PFN_vkGetDeviceMemoryOpaqueCaptureAddressKHR)0x0;
  vkGetCalibratedTimestampsKHR = (PFN_vkGetCalibratedTimestampsKHR)0x0;
  vkCmdBlitImage2KHR = (PFN_vkCmdBlitImage2KHR)0x0;
  vkCmdCopyBuffer2KHR = (PFN_vkCmdCopyBuffer2KHR)0x0;
  vkCmdCopyBufferToImage2KHR = (PFN_vkCmdCopyBufferToImage2KHR)0x0;
  vkCmdCopyImage2KHR = (PFN_vkCmdCopyImage2KHR)0x0;
  vkCmdCopyImageToBuffer2KHR = (PFN_vkCmdCopyImageToBuffer2KHR)0x0;
  vkCmdResolveImage2KHR = (PFN_vkCmdResolveImage2KHR)0x0;
  vkCmdBeginRenderPass2KHR = (PFN_vkCmdBeginRenderPass2KHR)0x0;
  vkCmdEndRenderPass2KHR = (PFN_vkCmdEndRenderPass2KHR)0x0;
  vkCmdNextSubpass2KHR = (PFN_vkCmdNextSubpass2KHR)0x0;
  vkCreateRenderPass2KHR = (PFN_vkCreateRenderPass2KHR)0x0;
  vkCreateDeferredOperationKHR = (PFN_vkCreateDeferredOperationKHR)0x0;
  vkDeferredOperationJoinKHR = (PFN_vkDeferredOperationJoinKHR)0x0;
  vkDestroyDeferredOperationKHR = (PFN_vkDestroyDeferredOperationKHR)0x0;
  vkGetDeferredOperationMaxConcurrencyKHR = (PFN_vkGetDeferredOperationMaxConcurrencyKHR)0x0;
  vkGetDeferredOperationResultKHR = (PFN_vkGetDeferredOperationResultKHR)0x0;
  vkCreateDescriptorUpdateTemplateKHR = (PFN_vkCreateDescriptorUpdateTemplateKHR)0x0;
  vkDestroyDescriptorUpdateTemplateKHR = (PFN_vkDestroyDescriptorUpdateTemplateKHR)0x0;
  vkUpdateDescriptorSetWithTemplateKHR = (PFN_vkUpdateDescriptorSetWithTemplateKHR)0x0;
  vkCmdDispatchBaseKHR = (PFN_vkCmdDispatchBaseKHR)0x0;
  vkCmdSetDeviceMaskKHR = (PFN_vkCmdSetDeviceMaskKHR)0x0;
  vkGetDeviceGroupPeerMemoryFeaturesKHR = (PFN_vkGetDeviceGroupPeerMemoryFeaturesKHR)0x0;
  vkCreateSharedSwapchainsKHR = (PFN_vkCreateSharedSwapchainsKHR)0x0;
  vkCmdDrawIndexedIndirectCountKHR = (PFN_vkCmdDrawIndexedIndirectCountKHR)0x0;
  vkCmdDrawIndirectCountKHR = (PFN_vkCmdDrawIndirectCountKHR)0x0;
  vkCmdBeginRenderingKHR = (PFN_vkCmdBeginRenderingKHR)0x0;
  vkCmdEndRenderingKHR = (PFN_vkCmdEndRenderingKHR)0x0;
  vkCmdSetRenderingAttachmentLocationsKHR = (PFN_vkCmdSetRenderingAttachmentLocationsKHR)0x0;
  vkCmdSetRenderingInputAttachmentIndicesKHR = (PFN_vkCmdSetRenderingInputAttachmentIndicesKHR)0x0;
  vkGetFenceFdKHR = (PFN_vkGetFenceFdKHR)0x0;
  vkImportFenceFdKHR = (PFN_vkImportFenceFdKHR)0x0;
  vkGetMemoryFdKHR = (PFN_vkGetMemoryFdKHR)0x0;
  vkGetMemoryFdPropertiesKHR = (PFN_vkGetMemoryFdPropertiesKHR)0x0;
  vkGetSemaphoreFdKHR = (PFN_vkGetSemaphoreFdKHR)0x0;
  vkImportSemaphoreFdKHR = (PFN_vkImportSemaphoreFdKHR)0x0;
  vkCmdSetFragmentShadingRateKHR = (PFN_vkCmdSetFragmentShadingRateKHR)0x0;
  vkGetBufferMemoryRequirements2KHR = (PFN_vkGetBufferMemoryRequirements2KHR)0x0;
  vkGetImageMemoryRequirements2KHR = (PFN_vkGetImageMemoryRequirements2KHR)0x0;
  vkGetImageSparseMemoryRequirements2KHR = (PFN_vkGetImageSparseMemoryRequirements2KHR)0x0;
  vkCmdSetLineStippleKHR = (PFN_vkCmdSetLineStippleKHR)0x0;
  vkTrimCommandPoolKHR = (PFN_vkTrimCommandPoolKHR)0x0;
  vkGetDescriptorSetLayoutSupportKHR = (PFN_vkGetDescriptorSetLayoutSupportKHR)0x0;
  vkGetDeviceBufferMemoryRequirementsKHR = (PFN_vkGetDeviceBufferMemoryRequirementsKHR)0x0;
  vkGetDeviceImageMemoryRequirementsKHR = (PFN_vkGetDeviceImageMemoryRequirementsKHR)0x0;
  vkGetDeviceImageSparseMemoryRequirementsKHR = (PFN_vkGetDeviceImageSparseMemoryRequirementsKHR)0x0
  ;
  vkCmdBindIndexBuffer2KHR = (PFN_vkCmdBindIndexBuffer2KHR)0x0;
  vkGetDeviceImageSubresourceLayoutKHR = (PFN_vkGetDeviceImageSubresourceLayoutKHR)0x0;
  vkGetImageSubresourceLayout2KHR = (PFN_vkGetImageSubresourceLayout2KHR)0x0;
  vkGetRenderingAreaGranularityKHR = (PFN_vkGetRenderingAreaGranularityKHR)0x0;
  vkCmdBindDescriptorSets2KHR = (PFN_vkCmdBindDescriptorSets2KHR)0x0;
  vkCmdPushConstants2KHR = (PFN_vkCmdPushConstants2KHR)0x0;
  vkCmdPushDescriptorSet2KHR = (PFN_vkCmdPushDescriptorSet2KHR)0x0;
  vkCmdPushDescriptorSetWithTemplate2KHR = (PFN_vkCmdPushDescriptorSetWithTemplate2KHR)0x0;
  vkCmdBindDescriptorBufferEmbeddedSamplers2EXT =
       (PFN_vkCmdBindDescriptorBufferEmbeddedSamplers2EXT)0x0;
  vkCmdSetDescriptorBufferOffsets2EXT = (PFN_vkCmdSetDescriptorBufferOffsets2EXT)0x0;
  vkMapMemory2KHR = (PFN_vkMapMemory2KHR)0x0;
  vkUnmapMemory2KHR = (PFN_vkUnmapMemory2KHR)0x0;
  vkAcquireProfilingLockKHR = (PFN_vkAcquireProfilingLockKHR)0x0;
  vkReleaseProfilingLockKHR = (PFN_vkReleaseProfilingLockKHR)0x0;
  vkCreatePipelineBinariesKHR = (PFN_vkCreatePipelineBinariesKHR)0x0;
  vkDestroyPipelineBinaryKHR = (PFN_vkDestroyPipelineBinaryKHR)0x0;
  vkGetPipelineBinaryDataKHR = (PFN_vkGetPipelineBinaryDataKHR)0x0;
  vkGetPipelineKeyKHR = (PFN_vkGetPipelineKeyKHR)0x0;
  vkReleaseCapturedPipelineDataKHR = (PFN_vkReleaseCapturedPipelineDataKHR)0x0;
  vkGetPipelineExecutableInternalRepresentationsKHR =
       (PFN_vkGetPipelineExecutableInternalRepresentationsKHR)0x0;
  vkGetPipelineExecutablePropertiesKHR = (PFN_vkGetPipelineExecutablePropertiesKHR)0x0;
  vkGetPipelineExecutableStatisticsKHR = (PFN_vkGetPipelineExecutableStatisticsKHR)0x0;
  vkWaitForPresentKHR = (PFN_vkWaitForPresentKHR)0x0;
  vkCmdPushDescriptorSetKHR = (PFN_vkCmdPushDescriptorSetKHR)0x0;
  vkCmdTraceRaysIndirect2KHR = (PFN_vkCmdTraceRaysIndirect2KHR)0x0;
  vkCmdSetRayTracingPipelineStackSizeKHR = (PFN_vkCmdSetRayTracingPipelineStackSizeKHR)0x0;
  vkCmdTraceRaysIndirectKHR = (PFN_vkCmdTraceRaysIndirectKHR)0x0;
  vkCmdTraceRaysKHR = (PFN_vkCmdTraceRaysKHR)0x0;
  vkCreateRayTracingPipelinesKHR = (PFN_vkCreateRayTracingPipelinesKHR)0x0;
  vkGetRayTracingCaptureReplayShaderGroupHandlesKHR =
       (PFN_vkGetRayTracingCaptureReplayShaderGroupHandlesKHR)0x0;
  vkGetRayTracingShaderGroupHandlesKHR = (PFN_vkGetRayTracingShaderGroupHandlesKHR)0x0;
  vkGetRayTracingShaderGroupStackSizeKHR = (PFN_vkGetRayTracingShaderGroupStackSizeKHR)0x0;
  vkCreateSamplerYcbcrConversionKHR = (PFN_vkCreateSamplerYcbcrConversionKHR)0x0;
  vkDestroySamplerYcbcrConversionKHR = (PFN_vkDestroySamplerYcbcrConversionKHR)0x0;
  vkGetSwapchainStatusKHR = (PFN_vkGetSwapchainStatusKHR)0x0;
  vkAcquireNextImageKHR = (PFN_vkAcquireNextImageKHR)0x0;
  vkCreateSwapchainKHR = (PFN_vkCreateSwapchainKHR)0x0;
  vkDestroySwapchainKHR = (PFN_vkDestroySwapchainKHR)0x0;
  vkGetSwapchainImagesKHR = (PFN_vkGetSwapchainImagesKHR)0x0;
  vkQueuePresentKHR = (PFN_vkQueuePresentKHR)0x0;
  vkCmdPipelineBarrier2KHR = (PFN_vkCmdPipelineBarrier2KHR)0x0;
  vkCmdResetEvent2KHR = (PFN_vkCmdResetEvent2KHR)0x0;
  vkCmdSetEvent2KHR = (PFN_vkCmdSetEvent2KHR)0x0;
  vkCmdWaitEvents2KHR = (PFN_vkCmdWaitEvents2KHR)0x0;
  vkCmdWriteTimestamp2KHR = (PFN_vkCmdWriteTimestamp2KHR)0x0;
  vkQueueSubmit2KHR = (PFN_vkQueueSubmit2KHR)0x0;
  vkGetSemaphoreCounterValueKHR = (PFN_vkGetSemaphoreCounterValueKHR)0x0;
  vkSignalSemaphoreKHR = (PFN_vkSignalSemaphoreKHR)0x0;
  vkWaitSemaphoresKHR = (PFN_vkWaitSemaphoresKHR)0x0;
  vkCmdDecodeVideoKHR = (PFN_vkCmdDecodeVideoKHR)0x0;
  vkCmdEncodeVideoKHR = (PFN_vkCmdEncodeVideoKHR)0x0;
  vkGetEncodedVideoSessionParametersKHR = (PFN_vkGetEncodedVideoSessionParametersKHR)0x0;
  vkBindVideoSessionMemoryKHR = (PFN_vkBindVideoSessionMemoryKHR)0x0;
  vkCmdBeginVideoCodingKHR = (PFN_vkCmdBeginVideoCodingKHR)0x0;
  vkCmdControlVideoCodingKHR = (PFN_vkCmdControlVideoCodingKHR)0x0;
  vkCmdEndVideoCodingKHR = (PFN_vkCmdEndVideoCodingKHR)0x0;
  vkCreateVideoSessionKHR = (PFN_vkCreateVideoSessionKHR)0x0;
  vkCreateVideoSessionParametersKHR = (PFN_vkCreateVideoSessionParametersKHR)0x0;
  vkDestroyVideoSessionKHR = (PFN_vkDestroyVideoSessionKHR)0x0;
  vkDestroyVideoSessionParametersKHR = (PFN_vkDestroyVideoSessionParametersKHR)0x0;
  vkGetVideoSessionMemoryRequirementsKHR = (PFN_vkGetVideoSessionMemoryRequirementsKHR)0x0;
  vkUpdateVideoSessionParametersKHR = (PFN_vkUpdateVideoSessionParametersKHR)0x0;
  vkCmdCuLaunchKernelNVX = (PFN_vkCmdCuLaunchKernelNVX)0x0;
  vkCreateCuFunctionNVX = (PFN_vkCreateCuFunctionNVX)0x0;
  vkCreateCuModuleNVX = (PFN_vkCreateCuModuleNVX)0x0;
  vkDestroyCuFunctionNVX = (PFN_vkDestroyCuFunctionNVX)0x0;
  vkDestroyCuModuleNVX = (PFN_vkDestroyCuModuleNVX)0x0;
  vkGetImageViewHandleNVX = (PFN_vkGetImageViewHandleNVX)0x0;
  vkGetImageViewHandle64NVX = (PFN_vkGetImageViewHandle64NVX)0x0;
  vkGetImageViewAddressNVX = (PFN_vkGetImageViewAddressNVX)0x0;
  vkCmdSetViewportWScalingNV = (PFN_vkCmdSetViewportWScalingNV)0x0;
  vkCmdBuildClusterAccelerationStructureIndirectNV =
       (PFN_vkCmdBuildClusterAccelerationStructureIndirectNV)0x0;
  vkGetClusterAccelerationStructureBuildSizesNV =
       (PFN_vkGetClusterAccelerationStructureBuildSizesNV)0x0;
  vkCmdConvertCooperativeVectorMatrixNV = (PFN_vkCmdConvertCooperativeVectorMatrixNV)0x0;
  vkConvertCooperativeVectorMatrixNV = (PFN_vkConvertCooperativeVectorMatrixNV)0x0;
  vkCmdCopyMemoryIndirectNV = (PFN_vkCmdCopyMemoryIndirectNV)0x0;
  vkCmdCopyMemoryToImageIndirectNV = (PFN_vkCmdCopyMemoryToImageIndirectNV)0x0;
  vkCmdCudaLaunchKernelNV = (PFN_vkCmdCudaLaunchKernelNV)0x0;
  vkCreateCudaFunctionNV = (PFN_vkCreateCudaFunctionNV)0x0;
  vkCreateCudaModuleNV = (PFN_vkCreateCudaModuleNV)0x0;
  vkDestroyCudaFunctionNV = (PFN_vkDestroyCudaFunctionNV)0x0;
  vkDestroyCudaModuleNV = (PFN_vkDestroyCudaModuleNV)0x0;
  vkGetCudaModuleCacheNV = (PFN_vkGetCudaModuleCacheNV)0x0;
  vkCmdSetCheckpointNV = (PFN_vkCmdSetCheckpointNV)0x0;
  vkGetQueueCheckpointDataNV = (PFN_vkGetQueueCheckpointDataNV)0x0;
  vkGetQueueCheckpointData2NV = (PFN_vkGetQueueCheckpointData2NV)0x0;
  vkCmdBindPipelineShaderGroupNV = (PFN_vkCmdBindPipelineShaderGroupNV)0x0;
  vkCmdExecuteGeneratedCommandsNV = (PFN_vkCmdExecuteGeneratedCommandsNV)0x0;
  vkCmdPreprocessGeneratedCommandsNV = (PFN_vkCmdPreprocessGeneratedCommandsNV)0x0;
  vkCreateIndirectCommandsLayoutNV = (PFN_vkCreateIndirectCommandsLayoutNV)0x0;
  vkDestroyIndirectCommandsLayoutNV = (PFN_vkDestroyIndirectCommandsLayoutNV)0x0;
  vkGetGeneratedCommandsMemoryRequirementsNV = (PFN_vkGetGeneratedCommandsMemoryRequirementsNV)0x0;
  vkCmdUpdatePipelineIndirectBufferNV = (PFN_vkCmdUpdatePipelineIndirectBufferNV)0x0;
  vkGetPipelineIndirectDeviceAddressNV = (PFN_vkGetPipelineIndirectDeviceAddressNV)0x0;
  vkGetPipelineIndirectMemoryRequirementsNV = (PFN_vkGetPipelineIndirectMemoryRequirementsNV)0x0;
  vkGetMemoryRemoteAddressNV = (PFN_vkGetMemoryRemoteAddressNV)0x0;
  vkCmdSetFragmentShadingRateEnumNV = (PFN_vkCmdSetFragmentShadingRateEnumNV)0x0;
  vkGetLatencyTimingsNV = (PFN_vkGetLatencyTimingsNV)0x0;
  vkLatencySleepNV = (PFN_vkLatencySleepNV)0x0;
  vkQueueNotifyOutOfBandNV = (PFN_vkQueueNotifyOutOfBandNV)0x0;
  vkSetLatencyMarkerNV = (PFN_vkSetLatencyMarkerNV)0x0;
  vkSetLatencySleepModeNV = (PFN_vkSetLatencySleepModeNV)0x0;
  vkCmdDecompressMemoryIndirectCountNV = (PFN_vkCmdDecompressMemoryIndirectCountNV)0x0;
  vkCmdDecompressMemoryNV = (PFN_vkCmdDecompressMemoryNV)0x0;
  vkCmdDrawMeshTasksIndirectNV = (PFN_vkCmdDrawMeshTasksIndirectNV)0x0;
  vkCmdDrawMeshTasksNV = (PFN_vkCmdDrawMeshTasksNV)0x0;
  vkCmdDrawMeshTasksIndirectCountNV = (PFN_vkCmdDrawMeshTasksIndirectCountNV)0x0;
  vkBindOpticalFlowSessionImageNV = (PFN_vkBindOpticalFlowSessionImageNV)0x0;
  vkCmdOpticalFlowExecuteNV = (PFN_vkCmdOpticalFlowExecuteNV)0x0;
  vkCreateOpticalFlowSessionNV = (PFN_vkCreateOpticalFlowSessionNV)0x0;
  vkDestroyOpticalFlowSessionNV = (PFN_vkDestroyOpticalFlowSessionNV)0x0;
  vkCmdBuildPartitionedAccelerationStructuresNV =
       (PFN_vkCmdBuildPartitionedAccelerationStructuresNV)0x0;
  vkGetPartitionedAccelerationStructuresBuildSizesNV =
       (PFN_vkGetPartitionedAccelerationStructuresBuildSizesNV)0x0;
  vkBindAccelerationStructureMemoryNV = (PFN_vkBindAccelerationStructureMemoryNV)0x0;
  vkCmdBuildAccelerationStructureNV = (PFN_vkCmdBuildAccelerationStructureNV)0x0;
  vkCmdCopyAccelerationStructureNV = (PFN_vkCmdCopyAccelerationStructureNV)0x0;
  vkCmdTraceRaysNV = (PFN_vkCmdTraceRaysNV)0x0;
  vkCmdWriteAccelerationStructuresPropertiesNV =
       (PFN_vkCmdWriteAccelerationStructuresPropertiesNV)0x0;
  vkCompileDeferredNV = (PFN_vkCompileDeferredNV)0x0;
  vkCreateAccelerationStructureNV = (PFN_vkCreateAccelerationStructureNV)0x0;
  vkCreateRayTracingPipelinesNV = (PFN_vkCreateRayTracingPipelinesNV)0x0;
  vkDestroyAccelerationStructureNV = (PFN_vkDestroyAccelerationStructureNV)0x0;
  vkGetAccelerationStructureHandleNV = (PFN_vkGetAccelerationStructureHandleNV)0x0;
  vkGetAccelerationStructureMemoryRequirementsNV =
       (PFN_vkGetAccelerationStructureMemoryRequirementsNV)0x0;
  vkGetRayTracingShaderGroupHandlesNV = (PFN_vkGetRayTracingShaderGroupHandlesNV)0x0;
  vkCmdSetExclusiveScissorEnableNV = (PFN_vkCmdSetExclusiveScissorEnableNV)0x0;
  vkCmdSetExclusiveScissorNV = (PFN_vkCmdSetExclusiveScissorNV)0x0;
  vkCmdBindShadingRateImageNV = (PFN_vkCmdBindShadingRateImageNV)0x0;
  vkCmdSetCoarseSampleOrderNV = (PFN_vkCmdSetCoarseSampleOrderNV)0x0;
  vkCmdSetViewportShadingRatePaletteNV = (PFN_vkCmdSetViewportShadingRatePaletteNV)0x0;
  vkGetDynamicRenderingTilePropertiesQCOM = (PFN_vkGetDynamicRenderingTilePropertiesQCOM)0x0;
  vkGetFramebufferTilePropertiesQCOM = (PFN_vkGetFramebufferTilePropertiesQCOM)0x0;
  vkGetDescriptorSetHostMappingVALVE = (PFN_vkGetDescriptorSetHostMappingVALVE)0x0;
  vkGetDescriptorSetLayoutHostMappingInfoVALVE =
       (PFN_vkGetDescriptorSetLayoutHostMappingInfoVALVE)0x0;
  vkCmdSetDepthClampRangeEXT = (PFN_vkCmdSetDepthClampRangeEXT)0x0;
  vkCmdBindVertexBuffers2EXT = (PFN_vkCmdBindVertexBuffers2EXT)0x0;
  vkCmdSetCullModeEXT = (PFN_vkCmdSetCullModeEXT)0x0;
  vkCmdSetDepthBoundsTestEnableEXT = (PFN_vkCmdSetDepthBoundsTestEnableEXT)0x0;
  vkCmdSetDepthCompareOpEXT = (PFN_vkCmdSetDepthCompareOpEXT)0x0;
  vkCmdSetDepthTestEnableEXT = (PFN_vkCmdSetDepthTestEnableEXT)0x0;
  vkCmdSetDepthWriteEnableEXT = (PFN_vkCmdSetDepthWriteEnableEXT)0x0;
  vkCmdSetFrontFaceEXT = (PFN_vkCmdSetFrontFaceEXT)0x0;
  vkCmdSetPrimitiveTopologyEXT = (PFN_vkCmdSetPrimitiveTopologyEXT)0x0;
  vkCmdSetScissorWithCountEXT = (PFN_vkCmdSetScissorWithCountEXT)0x0;
  vkCmdSetStencilOpEXT = (PFN_vkCmdSetStencilOpEXT)0x0;
  vkCmdSetStencilTestEnableEXT = (PFN_vkCmdSetStencilTestEnableEXT)0x0;
  vkCmdSetViewportWithCountEXT = (PFN_vkCmdSetViewportWithCountEXT)0x0;
  vkCmdSetDepthBiasEnableEXT = (PFN_vkCmdSetDepthBiasEnableEXT)0x0;
  vkCmdSetLogicOpEXT = (PFN_vkCmdSetLogicOpEXT)0x0;
  vkCmdSetPatchControlPointsEXT = (PFN_vkCmdSetPatchControlPointsEXT)0x0;
  vkCmdSetPrimitiveRestartEnableEXT = (PFN_vkCmdSetPrimitiveRestartEnableEXT)0x0;
  vkCmdSetRasterizerDiscardEnableEXT = (PFN_vkCmdSetRasterizerDiscardEnableEXT)0x0;
  vkCmdSetAlphaToCoverageEnableEXT = (PFN_vkCmdSetAlphaToCoverageEnableEXT)0x0;
  vkCmdSetAlphaToOneEnableEXT = (PFN_vkCmdSetAlphaToOneEnableEXT)0x0;
  vkCmdSetColorBlendEnableEXT = (PFN_vkCmdSetColorBlendEnableEXT)0x0;
  vkCmdSetColorBlendEquationEXT = (PFN_vkCmdSetColorBlendEquationEXT)0x0;
  vkCmdSetColorWriteMaskEXT = (PFN_vkCmdSetColorWriteMaskEXT)0x0;
  vkCmdSetDepthClampEnableEXT = (PFN_vkCmdSetDepthClampEnableEXT)0x0;
  vkCmdSetLogicOpEnableEXT = (PFN_vkCmdSetLogicOpEnableEXT)0x0;
  vkCmdSetPolygonModeEXT = (PFN_vkCmdSetPolygonModeEXT)0x0;
  vkCmdSetRasterizationSamplesEXT = (PFN_vkCmdSetRasterizationSamplesEXT)0x0;
  vkCmdSetSampleMaskEXT = (PFN_vkCmdSetSampleMaskEXT)0x0;
  vkCmdSetTessellationDomainOriginEXT = (PFN_vkCmdSetTessellationDomainOriginEXT)0x0;
  vkCmdSetRasterizationStreamEXT = (PFN_vkCmdSetRasterizationStreamEXT)0x0;
  vkCmdSetConservativeRasterizationModeEXT = (PFN_vkCmdSetConservativeRasterizationModeEXT)0x0;
  vkCmdSetExtraPrimitiveOverestimationSizeEXT = (PFN_vkCmdSetExtraPrimitiveOverestimationSizeEXT)0x0
  ;
  vkCmdSetDepthClipEnableEXT = (PFN_vkCmdSetDepthClipEnableEXT)0x0;
  vkCmdSetSampleLocationsEnableEXT = (PFN_vkCmdSetSampleLocationsEnableEXT)0x0;
  vkCmdSetColorBlendAdvancedEXT = (PFN_vkCmdSetColorBlendAdvancedEXT)0x0;
  vkCmdSetProvokingVertexModeEXT = (PFN_vkCmdSetProvokingVertexModeEXT)0x0;
  vkCmdSetLineRasterizationModeEXT = (PFN_vkCmdSetLineRasterizationModeEXT)0x0;
  vkCmdSetLineStippleEnableEXT = (PFN_vkCmdSetLineStippleEnableEXT)0x0;
  vkCmdSetDepthClipNegativeOneToOneEXT = (PFN_vkCmdSetDepthClipNegativeOneToOneEXT)0x0;
  vkCmdSetViewportWScalingEnableNV = (PFN_vkCmdSetViewportWScalingEnableNV)0x0;
  vkCmdSetViewportSwizzleNV = (PFN_vkCmdSetViewportSwizzleNV)0x0;
  vkCmdSetCoverageToColorEnableNV = (PFN_vkCmdSetCoverageToColorEnableNV)0x0;
  vkCmdSetCoverageToColorLocationNV = (PFN_vkCmdSetCoverageToColorLocationNV)0x0;
  vkCmdSetCoverageModulationModeNV = (PFN_vkCmdSetCoverageModulationModeNV)0x0;
  vkCmdSetCoverageModulationTableEnableNV = (PFN_vkCmdSetCoverageModulationTableEnableNV)0x0;
  vkCmdSetCoverageModulationTableNV = (PFN_vkCmdSetCoverageModulationTableNV)0x0;
  vkCmdSetShadingRateImageEnableNV = (PFN_vkCmdSetShadingRateImageEnableNV)0x0;
  vkCmdSetRepresentativeFragmentTestEnableNV = (PFN_vkCmdSetRepresentativeFragmentTestEnableNV)0x0;
  vkCmdSetCoverageReductionModeNV = (PFN_vkCmdSetCoverageReductionModeNV)0x0;
  vkGetImageSubresourceLayout2EXT = (PFN_vkGetImageSubresourceLayout2EXT)0x0;
  vkCmdSetVertexInputEXT = (PFN_vkCmdSetVertexInputEXT)0x0;
  vkCmdPushDescriptorSetWithTemplateKHR = (PFN_vkCmdPushDescriptorSetWithTemplateKHR)0x0;
  vkGetDeviceGroupPresentCapabilitiesKHR = (PFN_vkGetDeviceGroupPresentCapabilitiesKHR)0x0;
  vkGetDeviceGroupSurfacePresentModesKHR = (PFN_vkGetDeviceGroupSurfacePresentModesKHR)0x0;
  vkAcquireNextImage2KHR = (PFN_vkAcquireNextImage2KHR)0x0;
  loadedModule = (void *)0x0;
  loadedInstance = (VkInstance)0x0;
  loadedDevice = (VkDevice)0x0;
  return;
}

Assistant:

void volkFinalize(void)
{
	if (loadedModule)
	{
#if defined(_WIN32)
		FreeLibrary((HMODULE)loadedModule);
#else
		dlclose(loadedModule);
#endif
	}

	vkGetInstanceProcAddr = NULL;
	volkGenLoadLoader(NULL, nullProcAddrStub);
	volkGenLoadInstance(NULL, nullProcAddrStub);
	volkGenLoadDevice(NULL, nullProcAddrStub);

	loadedModule = NULL;
	loadedInstance = VK_NULL_HANDLE;
	loadedDevice = VK_NULL_HANDLE;
}